

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::getParam(Master *this,string *caller_id,string *key,Connection *param_3)

{
  XmlRpcValue *pXVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  RpcValue RVar2;
  allocator<char> local_c2;
  allocator<char> local_c1;
  XmlRpcValue local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  RpcValue value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  ParameterStorage::getParam((ParameterStorage *)&value,caller_id + 0x1d,key);
  if (value._type == TypeInvalid) {
    local_b0._M_dataplus._M_p._0_4_ = 0xffffffff;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_b0);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Parameter [",&local_c1);
    ::std::operator+(&local_40,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"] is not set",&local_c2);
    ::std::operator+(&local_b0,&local_40,&local_80);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_c0,&local_b0);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&local_c0);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_c0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    local_b0._M_dataplus._M_p._0_4_ = 0;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_b0);
  }
  else {
    local_b0._M_dataplus._M_p._0_4_ = 1;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_b0);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Parameter [",&local_c1);
    ::std::operator+(&local_40,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"]",&local_c2);
    ::std::operator+(&local_b0,&local_40,&local_80);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_c0,&local_b0);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&local_c0);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_c0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&value);
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue(&value);
  RVar2._value.asDouble = extraout_RDX.asDouble;
  RVar2._0_8_ = this;
  return RVar2;
}

Assistant:

Master::RpcValue Master::getParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  RpcValue value = m_parameterStorage.getParam(caller_id, key);
  if (!value.valid()) {
    res[0] = -1;
    res[1] = std::string("Parameter [") + key + std::string("] is not set");
    res[2] = 0;
  } else {
    res[0] = 1;
    res[1] = std::string("Parameter [") + key + std::string("]");
    res[2] = value;
  }
  return res;
}